

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ItemSize(ImVec2 *size,float text_baseline_y)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *g;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  pIVar4 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  if (pIVar3->SkipItems == false) {
    fVar6 = 0.0;
    if (0.0 <= text_baseline_y) {
      fVar6 = (pIVar3->DC).CurrLineTextBaseOffset - text_baseline_y;
      fVar6 = (float)(~-(uint)(fVar6 <= 0.0) & (uint)fVar6);
    }
    fVar1 = (pIVar3->DC).CurrLineSize.y;
    fVar6 = fVar6 + size->y;
    uVar5 = -(uint)(fVar6 <= fVar1);
    fVar8 = (float)(uVar5 & (uint)fVar1 | ~uVar5 & (uint)fVar6);
    fVar7 = (pIVar3->DC).CursorPos.x + size->x;
    fVar6 = (pIVar3->Pos).x;
    (pIVar3->DC).CursorPosPrevLine.x = fVar7;
    fVar1 = (pIVar3->DC).CursorPos.y;
    (pIVar3->DC).CursorPosPrevLine.y = fVar1;
    (pIVar3->DC).CursorPos.x =
         (float)(int)(fVar6 + (pIVar3->DC).Indent.x + (pIVar3->DC).ColumnsOffset.x);
    fVar6 = (pIVar4->Style).ItemSpacing.y;
    fVar9 = (float)(int)(fVar8 + fVar1 + fVar6);
    (pIVar3->DC).CursorPos.y = fVar9;
    fVar2 = (pIVar3->DC).CursorMaxPos.x;
    uVar5 = -(uint)(fVar7 <= fVar2);
    (pIVar3->DC).CursorMaxPos.x = (float)(uVar5 & (uint)fVar2 | ~uVar5 & (uint)fVar7);
    fVar2 = (pIVar3->DC).CursorMaxPos.y;
    fVar9 = fVar9 - fVar6;
    uVar5 = -(uint)(fVar9 <= fVar2);
    (pIVar3->DC).CursorMaxPos.y = (float)(uVar5 & (uint)fVar2 | ~uVar5 & (uint)fVar9);
    (pIVar3->DC).PrevLineSize.y = fVar8;
    (pIVar3->DC).CurrLineSize.y = 0.0;
    fVar6 = (pIVar3->DC).CurrLineTextBaseOffset;
    uVar5 = -(uint)(text_baseline_y <= fVar6);
    fVar6 = (float)(~uVar5 & (uint)text_baseline_y | (uint)fVar6 & uVar5);
    (pIVar3->DC).PrevLineTextBaseOffset = fVar6;
    (pIVar3->DC).CurrLineTextBaseOffset = 0.0;
    if ((pIVar3->DC).LayoutType == 0) {
      pIVar3->WriteAccessed = true;
      (pIVar3->DC).CursorPos.x = fVar7 + (pIVar4->Style).ItemSpacing.x;
      (pIVar3->DC).CursorPos.y = fVar1;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = fVar6;
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ItemSize(const ImVec2& size, float text_baseline_y)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    // We increase the height in this function to accommodate for baseline offset.
    // In theory we should be offsetting the starting position (window->DC.CursorPos), that will be the topic of a larger refactor,
    // but since ItemSize() is not yet an API that moves the cursor (to handle e.g. wrapping) enlarging the height has the same effect.
    const float offset_to_match_baseline_y = (text_baseline_y >= 0) ? ImMax(0.0f, window->DC.CurrLineTextBaseOffset - text_baseline_y) : 0.0f;
    const float line_height = ImMax(window->DC.CurrLineSize.y, size.y + offset_to_match_baseline_y);

    // Always align ourselves on pixel boundaries
    //if (g.IO.KeyAlt) window->DrawList->AddRect(window->DC.CursorPos, window->DC.CursorPos + ImVec2(size.x, line_height), IM_COL32(255,0,0,200)); // [DEBUG]
    window->DC.CursorPosPrevLine.x = window->DC.CursorPos.x + size.x;
    window->DC.CursorPosPrevLine.y = window->DC.CursorPos.y;
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);    // Next line
    window->DC.CursorPos.y = IM_FLOOR(window->DC.CursorPos.y + line_height + g.Style.ItemSpacing.y);        // Next line
    window->DC.CursorMaxPos.x = ImMax(window->DC.CursorMaxPos.x, window->DC.CursorPosPrevLine.x);
    window->DC.CursorMaxPos.y = ImMax(window->DC.CursorMaxPos.y, window->DC.CursorPos.y - g.Style.ItemSpacing.y);
    //if (g.IO.KeyAlt) window->DrawList->AddCircle(window->DC.CursorMaxPos, 3.0f, IM_COL32(255,0,0,255), 4); // [DEBUG]

    window->DC.PrevLineSize.y = line_height;
    window->DC.CurrLineSize.y = 0.0f;
    window->DC.PrevLineTextBaseOffset = ImMax(window->DC.CurrLineTextBaseOffset, text_baseline_y);
    window->DC.CurrLineTextBaseOffset = 0.0f;

    // Horizontal layout mode
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
        SameLine();
}